

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void * Curl_hash_pick(Curl_hash *h,void *key,size_t key_len)

{
  Curl_hash_element **ppCVar1;
  void *pvVar2;
  Curl_hash_element *pCVar3;
  
  ppCVar1 = h->table;
  if (ppCVar1 != (Curl_hash_element **)0x0) {
    pvVar2 = (void *)(*h->hash_func)(key,key_len,h->slots);
    pCVar3 = (Curl_hash_element *)(ppCVar1 + (long)pvVar2);
    do {
      pCVar3 = pCVar3->next;
      if (pCVar3 == (Curl_hash_element *)0x0) goto LAB_00131e7c;
      pvVar2 = (void *)(*h->comp_func)(pCVar3->key,pCVar3->key_len,key,key_len);
    } while (pvVar2 == (void *)0x0);
    pvVar2 = pCVar3->ptr;
LAB_00131e7c:
    if (pCVar3 != (Curl_hash_element *)0x0) {
      return pvVar2;
    }
  }
  return (void *)0x0;
}

Assistant:

void *
Curl_hash_pick(struct Curl_hash *h, void *key, size_t key_len)
{
  DEBUGASSERT(h);
  DEBUGASSERT(h->init == HASHINIT);
  if(h->table) {
    struct Curl_hash_element *he;
    DEBUGASSERT(h->slots);
    he = CURL_HASH_SLOT(h, key, key_len);
    while(he) {
      if(h->comp_func(he->key, he->key_len, key, key_len)) {
        return he->ptr;
      }
      he = he->next;
    }
  }
  return NULL;
}